

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::bindBuffer(ReferenceContext *this,deUint32 target,deUint32 buffer)

{
  ObjectManager<sglr::rc::DataBuffer> *this_00;
  bool bVar1;
  DataBuffer *buffer_00;
  deUint32 name;
  pair<unsigned_int,_sglr::rc::DataBuffer_*> local_38;
  
  bVar1 = isValidBufferTarget(target);
  if (bVar1) {
    if (buffer == 0) {
      buffer_00 = (DataBuffer *)0x0;
    }
    else {
      this_00 = &this->m_buffers;
      buffer_00 = rc::ObjectManager<sglr::rc::DataBuffer>::find(this_00,buffer);
      if (buffer_00 == (DataBuffer *)0x0) {
        buffer_00 = (DataBuffer *)operator_new(0x28);
        (buffer_00->super_NamedObject).m_name = buffer;
        (buffer_00->super_NamedObject).m_refCount = 1;
        (buffer_00->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__DataBuffer_00d57e28;
        (buffer_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (buffer_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (buffer_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (this_00->m_lastName < buffer) {
          this_00->m_lastName = buffer;
        }
        local_38.first = buffer;
        local_38.second = buffer_00;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::DataBuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::DataBuffer*>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::DataBuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>>
                    *)&(this->m_buffers).m_objects,&local_38);
      }
    }
    setBufferBinding(this,target,buffer_00);
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bindBuffer (deUint32 target, deUint32 buffer)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);

	rc::DataBuffer*	bufObj	= DE_NULL;

	if (buffer != 0)
	{
		bufObj = m_buffers.find(buffer);
		if (!bufObj)
		{
			bufObj = new DataBuffer(buffer);
			m_buffers.insert(bufObj);
		}
	}

	setBufferBinding(target, bufObj);
}